

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::insertLayout(QBoxLayout *this,int index,QLayout *layout,int stretch)

{
  bool bVar1;
  QBoxLayoutPrivate *pQVar2;
  QBoxLayoutItem *this_00;
  int in_ECX;
  long in_RDX;
  QLayout *in_RDI;
  QBoxLayoutItem *it;
  QBoxLayoutPrivate *d;
  QLayout *in_stack_ffffffffffffffb8;
  QLayoutItem *it_00;
  QLayout *in_stack_ffffffffffffffc8;
  QLayoutPrivate *in_stack_ffffffffffffffd0;
  int index_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  pQVar2 = d_func((QBoxLayout *)0x2f55f9);
  index_00 = (int)((ulong)pQVar2 >> 0x20);
  bVar1 = QLayoutPrivate::checkLayout(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((bVar1) && (bVar1 = QLayout::adoptLayout(in_RDI,in_stack_ffffffffffffffb8), bVar1)) {
    QBoxLayoutPrivate::validateIndex
              ((QBoxLayoutPrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),index_00);
    this_00 = (QBoxLayoutItem *)operator_new(0x10);
    it_00 = (QLayoutItem *)0x0;
    if (in_RDX != 0) {
      it_00 = (QLayoutItem *)(in_RDX + 0x10);
    }
    QBoxLayoutItem::QBoxLayoutItem(this_00,it_00,in_ECX);
    QList<QBoxLayoutItem_*>::insert
              ((QList<QBoxLayoutItem_*> *)it_00,in_RDX,(parameter_type)in_stack_ffffffffffffffc8);
    (**(code **)(*(long *)in_RDI + 0x70))();
  }
  return;
}

Assistant:

void QBoxLayout::insertLayout(int index, QLayout *layout, int stretch)
{
    Q_D(QBoxLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(layout, stretch);
    d->list.insert(index, it);
    invalidate();
}